

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInit.c
# Opt level: O2

int cuddZddInitUniv(DdManager *zdd)

{
  int *piVar1;
  uint uVar2;
  DdNode **ppDVar3;
  DdNode *pDVar4;
  int iVar5;
  DdNode *T;
  ulong uVar6;
  
  uVar2 = zdd->sizeZ;
  ppDVar3 = (DdNode **)malloc((long)(int)uVar2 * 8);
  zdd->univ = ppDVar3;
  if (ppDVar3 == (DdNode **)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
    iVar5 = 0;
  }
  else {
    T = zdd->one;
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    iVar5 = 1;
    for (uVar6 = (ulong)uVar2; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      pDVar4 = cuddUniqueInterZdd(zdd,zdd->invpermZ[uVar6 - 1],T,T);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,T);
        if (zdd->univ == (DdNode **)0x0) {
          return 0;
        }
        free(zdd->univ);
        zdd->univ = (DdNode **)0x0;
        return 0;
      }
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      zdd->univ[uVar6 - 1] = pDVar4;
      T = pDVar4;
    }
  }
  return iVar5;
}

Assistant:

int
cuddZddInitUniv(
  DdManager * zdd)
{
    DdNode      *p, *res;
    int         i;

    zdd->univ = ABC_ALLOC(DdNodePtr, zdd->sizeZ);
    if (zdd->univ == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    res = DD_ONE(zdd);
    cuddRef(res);
    for (i = zdd->sizeZ - 1; i >= 0; i--) {
        unsigned int index = zdd->invpermZ[i];
        p = res;
        res = cuddUniqueInterZdd(zdd, index, p, p);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd,p);
            ABC_FREE(zdd->univ);
            return(0);
        }
        cuddRef(res);
        cuddDeref(p);
        zdd->univ[i] = res;
    }

#ifdef DD_VERBOSE
    cuddZddP(zdd, zdd->univ[0]);
#endif

    return(1);

}